

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# loop_dependence.cpp
# Opt level: O3

Constraint * __thiscall
spvtools::opt::LoopDependenceAnalysis::IntersectConstraints
          (LoopDependenceAnalysis *this,Constraint *constraint_0,Constraint *constraint_1,
          SENode *lower_bound,SENode *upper_bound)

{
  ScalarEvolutionAnalysis *pSVar1;
  int64_t denominator_0;
  long *plVar2;
  long *plVar3;
  bool bVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  undefined4 extraout_var_03;
  undefined4 extraout_var_04;
  undefined4 extraout_var_05;
  undefined4 extraout_var_06;
  undefined4 extraout_var_07;
  undefined4 extraout_var_08;
  Constraint *pCVar8;
  undefined4 extraout_var_09;
  undefined4 extraout_var_10;
  undefined4 extraout_var_11;
  undefined4 extraout_var_12;
  undefined4 extraout_var_13;
  undefined4 extraout_var_14;
  undefined4 extraout_var_15;
  SENode *pSVar9;
  undefined4 extraout_var_16;
  undefined4 extraout_var_17;
  undefined4 extraout_var_18;
  undefined4 extraout_var_19;
  SENode *pSVar10;
  undefined4 extraout_var_20;
  undefined4 extraout_var_21;
  undefined4 extraout_var_22;
  undefined4 extraout_var_23;
  undefined4 extraout_var_24;
  undefined4 extraout_var_25;
  undefined4 extraout_var_26;
  undefined4 extraout_var_27;
  undefined4 extraout_var_28;
  undefined4 extraout_var_29;
  undefined4 extraout_var_30;
  undefined4 extraout_var_31;
  undefined4 extraout_var_32;
  undefined4 extraout_var_33;
  undefined4 extraout_var_34;
  undefined4 extraout_var_35;
  undefined4 extraout_var_36;
  undefined4 extraout_var_37;
  undefined4 extraout_var_38;
  undefined4 extraout_var_39;
  undefined4 extraout_var_40;
  undefined4 extraout_var_41;
  undefined4 extraout_var_42;
  undefined4 extraout_var_43;
  undefined4 extraout_var_44;
  undefined4 extraout_var_45;
  undefined4 extraout_var_46;
  undefined4 extraout_var_47;
  undefined4 extraout_var_48;
  undefined4 extraout_var_49;
  undefined4 extraout_var_50;
  undefined4 extraout_var_51;
  undefined4 extraout_var_52;
  undefined4 extraout_var_53;
  long lVar11;
  long lVar12;
  undefined4 extraout_var_54;
  undefined4 extraout_var_55;
  undefined4 extraout_var_56;
  undefined4 extraout_var_57;
  long lVar13;
  long integer;
  long lVar14;
  long lVar15;
  long lVar16;
  Constraint *pCVar17;
  int64_t numerator_0;
  long lVar18;
  SENode *local_78;
  SENode *local_70;
  SENode *local_68;
  SENode *local_58;
  Loop *local_48;
  SENode *local_40;
  SENode *local_38;
  
  iVar5 = (*constraint_0->_vptr_Constraint[9])(constraint_0);
  if (CONCAT44(extraout_var,iVar5) != 0) {
    return constraint_1;
  }
  iVar5 = (*constraint_1->_vptr_Constraint[9])(constraint_1);
  if (CONCAT44(extraout_var_00,iVar5) != 0) {
    return constraint_0;
  }
  iVar5 = (*constraint_0->_vptr_Constraint[5])(constraint_0);
  if ((CONCAT44(extraout_var_01,iVar5) == 0) ||
     (iVar5 = (*constraint_1->_vptr_Constraint[5])(constraint_1),
     CONCAT44(extraout_var_02,iVar5) == 0)) {
    iVar5 = (*constraint_0->_vptr_Constraint[7])(constraint_0);
    if ((CONCAT44(extraout_var_05,iVar5) != 0) &&
       (iVar5 = (*constraint_1->_vptr_Constraint[7])(constraint_1),
       CONCAT44(extraout_var_06,iVar5) != 0)) {
      iVar5 = (*constraint_0->_vptr_Constraint[7])(constraint_0);
      iVar6 = (*constraint_1->_vptr_Constraint[7])(constraint_1);
      bVar4 = SENode::operator==(*(SENode **)(CONCAT44(extraout_var_07,iVar5) + 0x10),
                                 *(SENode **)(CONCAT44(extraout_var_08,iVar6) + 0x10));
      if (!bVar4) goto LAB_0060bd78;
      pSVar9 = *(SENode **)(CONCAT44(extraout_var_07,iVar5) + 0x18);
      pSVar10 = *(SENode **)(CONCAT44(extraout_var_08,iVar6) + 0x18);
      goto LAB_0060bd6b;
    }
    iVar5 = (*constraint_0->_vptr_Constraint[5])(constraint_0);
    if (((CONCAT44(extraout_var_09,iVar5) == 0) &&
        (iVar5 = (*constraint_0->_vptr_Constraint[3])(constraint_0),
        CONCAT44(extraout_var_10,iVar5) == 0)) ||
       ((iVar5 = (*constraint_1->_vptr_Constraint[5])(constraint_1),
        CONCAT44(extraout_var_11,iVar5) == 0 &&
        (iVar5 = (*constraint_1->_vptr_Constraint[3])(constraint_1),
        CONCAT44(extraout_var_12,iVar5) == 0)))) {
      iVar5 = (*constraint_0->_vptr_Constraint[7])(constraint_0);
      if (((CONCAT44(extraout_var_35,iVar5) == 0) ||
          ((iVar5 = (*constraint_1->_vptr_Constraint[3])(constraint_1),
           CONCAT44(extraout_var_36,iVar5) == 0 &&
           (iVar5 = (*constraint_1->_vptr_Constraint[5])(constraint_1),
           CONCAT44(extraout_var_37,iVar5) == 0)))) &&
         ((iVar5 = (*constraint_1->_vptr_Constraint[7])(constraint_1),
          CONCAT44(extraout_var_38,iVar5) == 0 ||
          ((iVar5 = (*constraint_0->_vptr_Constraint[3])(constraint_0),
           CONCAT44(extraout_var_39,iVar5) == 0 &&
           (iVar5 = (*constraint_0->_vptr_Constraint[5])(constraint_0),
           CONCAT44(extraout_var_40,iVar5) == 0)))))) {
        return (Constraint *)0x0;
      }
      iVar5 = (*constraint_0->_vptr_Constraint[7])(constraint_0);
      pCVar17 = constraint_1;
      pCVar8 = constraint_0;
      if (CONCAT44(extraout_var_41,iVar5) == 0) {
        pCVar17 = constraint_0;
        pCVar8 = constraint_1;
      }
      iVar6 = (*pCVar8->_vptr_Constraint[7])();
      iVar7 = (*pCVar17->_vptr_Constraint[5])(pCVar17);
      if (CONCAT44(extraout_var_43,iVar7) == 0) {
        iVar7 = (*pCVar17->_vptr_Constraint[3])(pCVar17);
        pSVar9 = *(SENode **)(CONCAT44(extraout_var_45,iVar7) + 0x10);
        iVar7 = (*pCVar17->_vptr_Constraint[3])(pCVar17);
        local_70 = *(SENode **)(CONCAT44(extraout_var_46,iVar7) + 0x18);
        iVar7 = (*pCVar17->_vptr_Constraint[3])(pCVar17);
        pSVar10 = *(SENode **)(CONCAT44(extraout_var_47,iVar7) + 0x20);
      }
      else {
        pSVar1 = &this->scalar_evolution_;
        pSVar9 = ScalarEvolutionAnalysis::CreateConstant(pSVar1,1);
        local_70 = ScalarEvolutionAnalysis::CreateConstant(pSVar1,-1);
        iVar7 = (*pCVar17->_vptr_Constraint[5])(pCVar17);
        pSVar10 = ScalarEvolutionAnalysis::CreateNegation
                            (pSVar1,*(SENode **)(CONCAT44(extraout_var_44,iVar7) + 0x10));
        pSVar10 = ScalarEvolutionAnalysis::SimplifyExpression(pSVar1,pSVar10);
      }
      plVar2 = *(long **)(CONCAT44(extraout_var_42,iVar6) + 0x10);
      plVar3 = *(long **)(CONCAT44(extraout_var_42,iVar6) + 0x18);
      iVar6 = (*pSVar9->_vptr_SENode[4])(pSVar9);
      if ((((CONCAT44(extraout_var_48,iVar6) != 0) &&
           (iVar6 = (*local_70->_vptr_SENode[4])(), CONCAT44(extraout_var_49,iVar6) != 0)) &&
          (iVar6 = (*pSVar10->_vptr_SENode[4])(pSVar10), CONCAT44(extraout_var_50,iVar6) != 0)) &&
         ((lVar14 = (**(code **)(*plVar2 + 0x20))(), lVar14 != 0 &&
          (lVar14 = (**(code **)(*plVar3 + 0x20))(plVar3), lVar14 != 0)))) {
        iVar6 = (*pSVar9->_vptr_SENode[4])(pSVar9);
        lVar14 = *(long *)(CONCAT44(extraout_var_51,iVar6) + 0x30);
        iVar6 = (*local_70->_vptr_SENode[4])();
        lVar16 = *(long *)(CONCAT44(extraout_var_52,iVar6) + 0x30);
        iVar6 = (*pSVar10->_vptr_SENode[4])();
        lVar18 = *(long *)(CONCAT44(extraout_var_53,iVar6) + 0x30);
        lVar11 = (**(code **)(*plVar2 + 0x20))();
        lVar11 = *(long *)(lVar11 + 0x30);
        lVar12 = (**(code **)(*plVar3 + 0x20))(plVar3);
        if (lVar16 * *(long *)(lVar12 + 0x30) + lVar14 * lVar11 == lVar18) {
          if (CONCAT44(extraout_var_41,iVar5) != 0) {
            return constraint_0;
          }
          return constraint_1;
        }
        goto LAB_0060bd78;
      }
LAB_0060c353:
      pCVar8 = make_constraint<spvtools::opt::DependenceNone>(this);
      return pCVar8;
    }
    iVar5 = (*constraint_0->_vptr_Constraint[5])(constraint_0);
    iVar6 = (*constraint_1->_vptr_Constraint[5])(constraint_1);
    if (CONCAT44(extraout_var_13,iVar5) == 0) {
      iVar5 = (*constraint_0->_vptr_Constraint[3])(constraint_0);
      local_70 = *(SENode **)(CONCAT44(extraout_var_16,iVar5) + 0x10);
      iVar5 = (*constraint_0->_vptr_Constraint[3])(constraint_0);
      local_58 = *(SENode **)(CONCAT44(extraout_var_17,iVar5) + 0x18);
      iVar5 = (*constraint_0->_vptr_Constraint[3])(constraint_0);
      pSVar9 = *(SENode **)(CONCAT44(extraout_var_18,iVar5) + 0x20);
    }
    else {
      pSVar1 = &this->scalar_evolution_;
      local_70 = ScalarEvolutionAnalysis::CreateConstant(pSVar1,1);
      local_58 = ScalarEvolutionAnalysis::CreateConstant(pSVar1,-1);
      iVar5 = (*constraint_0->_vptr_Constraint[5])(constraint_0);
      pSVar9 = ScalarEvolutionAnalysis::CreateNegation
                         (pSVar1,*(SENode **)(CONCAT44(extraout_var_15,iVar5) + 0x10));
      pSVar9 = ScalarEvolutionAnalysis::SimplifyExpression(pSVar1,pSVar9);
    }
    if (CONCAT44(extraout_var_14,iVar6) == 0) {
      iVar5 = (*constraint_1->_vptr_Constraint[3])(constraint_1);
      local_78 = *(SENode **)(CONCAT44(extraout_var_20,iVar5) + 0x10);
      iVar5 = (*constraint_1->_vptr_Constraint[3])(constraint_1);
      local_68 = *(SENode **)(CONCAT44(extraout_var_21,iVar5) + 0x18);
      iVar5 = (*constraint_1->_vptr_Constraint[3])(constraint_1);
      pSVar10 = *(SENode **)(CONCAT44(extraout_var_22,iVar5) + 0x20);
    }
    else {
      pSVar1 = &this->scalar_evolution_;
      local_78 = ScalarEvolutionAnalysis::CreateConstant(pSVar1,1);
      local_68 = ScalarEvolutionAnalysis::CreateConstant(pSVar1,-1);
      iVar5 = (*constraint_1->_vptr_Constraint[5])(constraint_1);
      pSVar10 = ScalarEvolutionAnalysis::CreateNegation
                          (pSVar1,*(SENode **)(CONCAT44(extraout_var_19,iVar5) + 0x10));
      pSVar10 = ScalarEvolutionAnalysis::SimplifyExpression(pSVar1,pSVar10);
    }
    iVar5 = (*local_70->_vptr_SENode[4])(local_70);
    if (((CONCAT44(extraout_var_23,iVar5) == 0) ||
        (iVar5 = (*local_58->_vptr_SENode[4])(), CONCAT44(extraout_var_24,iVar5) == 0)) ||
       ((iVar5 = (*pSVar9->_vptr_SENode[4])(), CONCAT44(extraout_var_25,iVar5) == 0 ||
        (((iVar5 = (*local_78->_vptr_SENode[4])(), CONCAT44(extraout_var_26,iVar5) == 0 ||
          (iVar5 = (*local_68->_vptr_SENode[4])(), CONCAT44(extraout_var_27,iVar5) == 0)) ||
         (iVar5 = (*pSVar10->_vptr_SENode[4])(pSVar10), CONCAT44(extraout_var_28,iVar5) == 0))))))
    goto LAB_0060c353;
    iVar5 = (*local_70->_vptr_SENode[4])(local_70);
    numerator_0 = *(int64_t *)(CONCAT44(extraout_var_29,iVar5) + 0x30);
    iVar5 = (*local_58->_vptr_SENode[4])();
    denominator_0 = *(int64_t *)(CONCAT44(extraout_var_30,iVar5) + 0x30);
    iVar5 = (*pSVar9->_vptr_SENode[4])();
    lVar14 = *(long *)(CONCAT44(extraout_var_31,iVar5) + 0x30);
    iVar5 = (*local_78->_vptr_SENode[4])();
    lVar16 = *(long *)(CONCAT44(extraout_var_32,iVar5) + 0x30);
    iVar5 = (*local_68->_vptr_SENode[4])();
    local_78 = *(SENode **)(CONCAT44(extraout_var_33,iVar5) + 0x30);
    iVar5 = (*pSVar10->_vptr_SENode[4])(pSVar10);
    lVar18 = *(long *)(CONCAT44(extraout_var_34,iVar5) + 0x30);
    bVar4 = anon_unknown_15::NormalizeAndCompareFractions
                      (numerator_0,denominator_0,lVar16,(int64_t)local_78);
    if (!bVar4) {
      iVar5 = (*upper_bound->_vptr_SENode[5])(upper_bound);
      if ((CONCAT44(extraout_var_54,iVar5) != 0) &&
         (iVar5 = (*lower_bound->_vptr_SENode[5])(lower_bound), CONCAT44(extraout_var_55,iVar5) != 0
         )) {
        iVar5 = (*lower_bound->_vptr_SENode[5])(lower_bound);
        lVar11 = *(long *)(CONCAT44(extraout_var_56,iVar5) + 0x30);
        iVar5 = (*upper_bound->_vptr_SENode[5])(upper_bound);
        lVar12 = *(long *)(CONCAT44(extraout_var_57,iVar5) + 0x30);
        lVar13 = (long)local_78 * lVar14 - lVar18 * denominator_0;
        lVar15 = (long)local_78 * numerator_0 - lVar16 * denominator_0;
        integer = lVar13 / lVar15;
        if ((local_78 == (SENode *)0x0) &&
           (lVar18 = lVar14, lVar16 = numerator_0, local_78 = (SENode *)denominator_0,
           denominator_0 == 0)) {
          local_78 = (SENode *)0x0;
          lVar18 = 0;
          lVar14 = 0;
        }
        else {
          lVar18 = lVar18 - lVar16 * integer;
          lVar14 = lVar18 / (long)local_78;
        }
        if (((lVar13 % lVar15 == 0) && (lVar18 % (long)local_78 == 0)) &&
           ((lVar11 <= integer &&
            (((integer <= lVar12 && (lVar11 <= lVar14)) && (lVar14 <= lVar12)))))) {
          local_38 = ScalarEvolutionAnalysis::CreateConstant(&this->scalar_evolution_,integer);
          local_40 = ScalarEvolutionAnalysis::CreateConstant(&this->scalar_evolution_,lVar14);
          local_48 = constraint_0->loop_;
          pCVar8 = make_constraint<spvtools::opt::DependencePoint,spvtools::opt::SENode*,spvtools::opt::SENode*,spvtools::opt::Loop_const*>
                             (this,&local_38,&local_40,&local_48);
          return pCVar8;
        }
        goto LAB_0060bd78;
      }
      goto LAB_0060c353;
    }
    if (local_78 != (SENode *)0x0 || denominator_0 != 0) {
      lVar16 = (long)local_78;
      numerator_0 = denominator_0;
    }
    bVar4 = anon_unknown_15::NormalizeAndCompareFractions(lVar14,numerator_0,lVar18,lVar16);
  }
  else {
    iVar5 = (*constraint_0->_vptr_Constraint[5])(constraint_0);
    iVar6 = (*constraint_1->_vptr_Constraint[5])(constraint_1);
    pSVar9 = *(SENode **)(CONCAT44(extraout_var_03,iVar5) + 0x10);
    pSVar10 = *(SENode **)(CONCAT44(extraout_var_04,iVar6) + 0x10);
LAB_0060bd6b:
    bVar4 = SENode::operator==(pSVar9,pSVar10);
  }
  if (bVar4 != false) {
    return constraint_0;
  }
LAB_0060bd78:
  pCVar8 = make_constraint<spvtools::opt::DependenceEmpty>(this);
  return pCVar8;
}

Assistant:

Constraint* LoopDependenceAnalysis::IntersectConstraints(
    Constraint* constraint_0, Constraint* constraint_1,
    const SENode* lower_bound, const SENode* upper_bound) {
  if (constraint_0->AsDependenceNone()) {
    return constraint_1;
  } else if (constraint_1->AsDependenceNone()) {
    return constraint_0;
  }

  // Both constraints are distances. Either the same distance or independent.
  if (constraint_0->AsDependenceDistance() &&
      constraint_1->AsDependenceDistance()) {
    auto dist_0 = constraint_0->AsDependenceDistance();
    auto dist_1 = constraint_1->AsDependenceDistance();

    if (*dist_0->GetDistance() == *dist_1->GetDistance()) {
      return constraint_0;
    } else {
      return make_constraint<DependenceEmpty>();
    }
  }

  // Both constraints are points. Either the same point or independent.
  if (constraint_0->AsDependencePoint() && constraint_1->AsDependencePoint()) {
    auto point_0 = constraint_0->AsDependencePoint();
    auto point_1 = constraint_1->AsDependencePoint();

    if (*point_0->GetSource() == *point_1->GetSource() &&
        *point_0->GetDestination() == *point_1->GetDestination()) {
      return constraint_0;
    } else {
      return make_constraint<DependenceEmpty>();
    }
  }

  // Both constraints are lines/distances.
  if ((constraint_0->AsDependenceDistance() ||
       constraint_0->AsDependenceLine()) &&
      (constraint_1->AsDependenceDistance() ||
       constraint_1->AsDependenceLine())) {
    auto is_distance_0 = constraint_0->AsDependenceDistance() != nullptr;
    auto is_distance_1 = constraint_1->AsDependenceDistance() != nullptr;

    auto a0 = is_distance_0 ? scalar_evolution_.CreateConstant(1)
                            : constraint_0->AsDependenceLine()->GetA();
    auto b0 = is_distance_0 ? scalar_evolution_.CreateConstant(-1)
                            : constraint_0->AsDependenceLine()->GetB();
    auto c0 =
        is_distance_0
            ? scalar_evolution_.SimplifyExpression(
                  scalar_evolution_.CreateNegation(
                      constraint_0->AsDependenceDistance()->GetDistance()))
            : constraint_0->AsDependenceLine()->GetC();

    auto a1 = is_distance_1 ? scalar_evolution_.CreateConstant(1)
                            : constraint_1->AsDependenceLine()->GetA();
    auto b1 = is_distance_1 ? scalar_evolution_.CreateConstant(-1)
                            : constraint_1->AsDependenceLine()->GetB();
    auto c1 =
        is_distance_1
            ? scalar_evolution_.SimplifyExpression(
                  scalar_evolution_.CreateNegation(
                      constraint_1->AsDependenceDistance()->GetDistance()))
            : constraint_1->AsDependenceLine()->GetC();

    if (a0->AsSEConstantNode() && b0->AsSEConstantNode() &&
        c0->AsSEConstantNode() && a1->AsSEConstantNode() &&
        b1->AsSEConstantNode() && c1->AsSEConstantNode()) {
      auto constant_a0 = a0->AsSEConstantNode()->FoldToSingleValue();
      auto constant_b0 = b0->AsSEConstantNode()->FoldToSingleValue();
      auto constant_c0 = c0->AsSEConstantNode()->FoldToSingleValue();

      auto constant_a1 = a1->AsSEConstantNode()->FoldToSingleValue();
      auto constant_b1 = b1->AsSEConstantNode()->FoldToSingleValue();
      auto constant_c1 = c1->AsSEConstantNode()->FoldToSingleValue();

      // a & b can't both be zero, otherwise it wouldn't be line.
      if (NormalizeAndCompareFractions(constant_a0, constant_b0, constant_a1,
                                       constant_b1)) {
        // Slopes are equal, either parallel lines or the same line.

        if (constant_b0 == 0 && constant_b1 == 0) {
          if (NormalizeAndCompareFractions(constant_c0, constant_a0,
                                           constant_c1, constant_a1)) {
            return constraint_0;
          }

          return make_constraint<DependenceEmpty>();
        } else if (NormalizeAndCompareFractions(constant_c0, constant_b0,
                                                constant_c1, constant_b1)) {
          // Same line.
          return constraint_0;
        } else {
          // Parallel lines can't intersect, report independence.
          return make_constraint<DependenceEmpty>();
        }

      } else {
        // Lines are not parallel, therefore, they must intersect.

        // Calculate intersection.
        if (upper_bound->AsSEConstantNode() &&
            lower_bound->AsSEConstantNode()) {
          auto constant_lower_bound =
              lower_bound->AsSEConstantNode()->FoldToSingleValue();
          auto constant_upper_bound =
              upper_bound->AsSEConstantNode()->FoldToSingleValue();

          auto up = constant_b1 * constant_c0 - constant_b0 * constant_c1;
          // Both b or both a can't be 0, so down is never 0
          // otherwise would have entered the parallel line section.
          auto down = constant_b1 * constant_a0 - constant_b0 * constant_a1;

          auto x_coord = up / down;

          int64_t y_coord = 0;
          int64_t arg1 = 0;
          int64_t const_b_to_use = 0;

          if (constant_b1 != 0) {
            arg1 = constant_c1 - constant_a1 * x_coord;
            y_coord = arg1 / constant_b1;
            const_b_to_use = constant_b1;
          } else if (constant_b0 != 0) {
            arg1 = constant_c0 - constant_a0 * x_coord;
            y_coord = arg1 / constant_b0;
            const_b_to_use = constant_b0;
          }

          if (up % down == 0 &&
              arg1 % const_b_to_use == 0 &&  // Coordinates are integers.
              constant_lower_bound <=
                  x_coord &&  // x_coord is within loop bounds.
              x_coord <= constant_upper_bound &&
              constant_lower_bound <=
                  y_coord &&  // y_coord is within loop bounds.
              y_coord <= constant_upper_bound) {
            // Lines intersect at integer coordinates.
            return make_constraint<DependencePoint>(
                scalar_evolution_.CreateConstant(x_coord),
                scalar_evolution_.CreateConstant(y_coord),
                constraint_0->GetLoop());

          } else {
            return make_constraint<DependenceEmpty>();
          }

        } else {
          // Not constants, bail out.
          return make_constraint<DependenceNone>();
        }
      }

    } else {
      // Not constants, bail out.
      return make_constraint<DependenceNone>();
    }
  }

  // One constraint is a line/distance and the other is a point.
  if ((constraint_0->AsDependencePoint() &&
       (constraint_1->AsDependenceLine() ||
        constraint_1->AsDependenceDistance())) ||
      (constraint_1->AsDependencePoint() &&
       (constraint_0->AsDependenceLine() ||
        constraint_0->AsDependenceDistance()))) {
    auto point_0 = constraint_0->AsDependencePoint() != nullptr;

    auto point = point_0 ? constraint_0->AsDependencePoint()
                         : constraint_1->AsDependencePoint();

    auto line_or_distance = point_0 ? constraint_1 : constraint_0;

    auto is_distance = line_or_distance->AsDependenceDistance() != nullptr;

    auto a = is_distance ? scalar_evolution_.CreateConstant(1)
                         : line_or_distance->AsDependenceLine()->GetA();
    auto b = is_distance ? scalar_evolution_.CreateConstant(-1)
                         : line_or_distance->AsDependenceLine()->GetB();
    auto c =
        is_distance
            ? scalar_evolution_.SimplifyExpression(
                  scalar_evolution_.CreateNegation(
                      line_or_distance->AsDependenceDistance()->GetDistance()))
            : line_or_distance->AsDependenceLine()->GetC();

    auto x = point->GetSource();
    auto y = point->GetDestination();

    if (a->AsSEConstantNode() && b->AsSEConstantNode() &&
        c->AsSEConstantNode() && x->AsSEConstantNode() &&
        y->AsSEConstantNode()) {
      auto constant_a = a->AsSEConstantNode()->FoldToSingleValue();
      auto constant_b = b->AsSEConstantNode()->FoldToSingleValue();
      auto constant_c = c->AsSEConstantNode()->FoldToSingleValue();

      auto constant_x = x->AsSEConstantNode()->FoldToSingleValue();
      auto constant_y = y->AsSEConstantNode()->FoldToSingleValue();

      auto left_hand_side = constant_a * constant_x + constant_b * constant_y;

      if (left_hand_side == constant_c) {
        // Point is on line, return point
        return point_0 ? constraint_0 : constraint_1;
      } else {
        // Point not on line, report independence (empty constraint).
        return make_constraint<DependenceEmpty>();
      }

    } else {
      // Not constants, bail out.
      return make_constraint<DependenceNone>();
    }
  }

  return nullptr;
}